

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_new_connection_id_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  byte *cid;
  byte bVar1;
  byte *end;
  byte *pbVar2;
  int iVar3;
  uint64_t sequence;
  uint64_t retire_prior_to;
  size_t i;
  ulong uVar4;
  size_t num_unregistered_seqs;
  uint64_t unregistered_seqs [4];
  
  end = state->end;
  sequence = ptls_decode_quicint(&state->src,end);
  iVar3 = 0x20007;
  if (sequence != 0xffffffffffffffff) {
    retire_prior_to = ptls_decode_quicint(&state->src,end);
    if ((retire_prior_to <= sequence) &&
       (pbVar2 = state->src, end != pbVar2 && -1 < (long)end - (long)pbVar2)) {
      cid = pbVar2 + 1;
      state->src = cid;
      bVar1 = *pbVar2;
      if ((byte)(bVar1 - 1) < 0x14) {
        pbVar2 = cid + bVar1;
        state->src = pbVar2;
        if (0xf < (long)end - (long)pbVar2) {
          state->src = pbVar2 + 0x10;
          if (sequence < (conn->super).remote.largest_retire_prior_to) {
            schedule_retire_connection_id_frame(conn,sequence);
            iVar3 = 0;
          }
          else {
            iVar3 = quicly_remote_cid_register
                              (&(conn->super).remote.cid_set,sequence,cid,(ulong)bVar1,pbVar2,
                               retire_prior_to,unregistered_seqs,&num_unregistered_seqs);
            if (iVar3 == 0) {
              for (uVar4 = 0; uVar4 < num_unregistered_seqs; uVar4 = uVar4 + 1) {
                schedule_retire_connection_id_frame(conn,unregistered_seqs[uVar4]);
              }
              iVar3 = 0;
              if ((conn->super).remote.largest_retire_prior_to < retire_prior_to) {
                (conn->super).remote.largest_retire_prior_to = retire_prior_to;
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int handle_new_connection_id_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret;
    quicly_new_connection_id_frame_t frame;

    /* TODO: return error when using zero-length CID */

    if ((ret = quicly_decode_new_connection_id_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(NEW_CONNECTION_ID_RECEIVE, conn, conn->stash.now, frame.sequence, frame.retire_prior_to,
                 QUICLY_PROBE_HEXDUMP(frame.cid.base, frame.cid.len),
                 QUICLY_PROBE_HEXDUMP(frame.stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN));

    if (frame.sequence < conn->super.remote.largest_retire_prior_to) {
        /* An endpoint that receives a NEW_CONNECTION_ID frame with a sequence number smaller than the Retire Prior To
         * field of a previously received NEW_CONNECTION_ID frame MUST send a corresponding RETIRE_CONNECTION_ID frame
         * that retires the newly received connection ID, unless it has already done so for that sequence number. (19.15)
         * TODO: "unless ..." part may not be properly addressed here (we may already have sent the RCID frame for this
         * sequence) */
        schedule_retire_connection_id_frame(conn, frame.sequence);
        /* do not install this CID */
        return 0;
    }

    uint64_t unregistered_seqs[QUICLY_LOCAL_ACTIVE_CONNECTION_ID_LIMIT];
    size_t num_unregistered_seqs;
    if ((ret = quicly_remote_cid_register(&conn->super.remote.cid_set, frame.sequence, frame.cid.base, frame.cid.len,
                                          frame.stateless_reset_token, frame.retire_prior_to, unregistered_seqs,
                                          &num_unregistered_seqs)) != 0)
        return ret;

    for (size_t i = 0; i < num_unregistered_seqs; i++)
        schedule_retire_connection_id_frame(conn, unregistered_seqs[i]);

    if (frame.retire_prior_to > conn->super.remote.largest_retire_prior_to)
        conn->super.remote.largest_retire_prior_to = frame.retire_prior_to;

    return 0;
}